

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O1

void __thiscall Corrade::Utility::Arguments::Arguments(Arguments *this,Flags flags)

{
  char **ppcVar1;
  ostream *output;
  Error local_b8;
  string local_90;
  string local_70;
  string local_50;
  
  (this->_flags)._value = flags._value;
  this->_finalOptionalArgument = 0;
  this->_arrayArgument = 0;
  (this->_prefix)._M_dataplus._M_p = (pointer)&(this->_prefix).field_2;
  (this->_prefix)._M_string_length = 0;
  (this->_prefix).field_2._M_local_buf[0] = '\0';
  (this->_command)._M_dataplus._M_p = (pointer)&(this->_command).field_2;
  (this->_command)._M_string_length = 0;
  (this->_command).field_2._M_local_buf[0] = '\0';
  (this->_help)._M_dataplus._M_p = (pointer)&(this->_help).field_2;
  (this->_help)._M_string_length = 0;
  (this->_help).field_2._M_local_buf[0] = '\0';
  (this->_entries)._data = (Entry *)0x0;
  (this->_entries)._size = 0;
  (this->_entries)._deleter = (_func_void_Entry_ptr_unsigned_long *)0x0;
  (this->_values)._data = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->_values)._size = 0;
  (this->_values)._deleter =
       (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_unsigned_long
        *)0x0;
  (this->_arrayValues)._data =
       (Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
        *)0x0;
  (this->_arrayValues)._size = 0;
  (this->_arrayValues)._deleter =
       (_func_void_Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ptr)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr,_unsigned_long)>_ptr_unsigned_long
        *)0x0;
  (this->_skippedPrefixes)._data =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  (this->_skippedPrefixes)._size = 0;
  (this->_skippedPrefixes)._deleter =
       (_func_void_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_ptr_unsigned_long
        *)0x0;
  (this->_booleans)._data = (bool *)0x0;
  (this->_booleans)._size = 0;
  (this->_booleans)._deleter = (_func_void_bool_ptr_unsigned_long *)0x0;
  this->_parseErrorCallback = anon_unknown_3::defaultParseErrorCallback;
  if ((flags._value & 1) == 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"help","");
    addBooleanOption(this,'h',&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    ppcVar1 = &local_b8.super_Debug._sourceLocationFile;
    local_b8.super_Debug._output = (ostream *)ppcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"help","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"display this help message and exit","");
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    setHelp(this,(string *)&local_b8,&local_90,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_b8.super_Debug._output != (ostream *)ppcVar1) {
      operator_delete(local_b8.super_Debug._output);
    }
    return;
  }
  output = Error::defaultOutput();
  Error::Error(&local_b8,output,(Flags)0x0);
  Debug::operator<<(&local_b8.super_Debug,
                    "Utility::Arguments: Flag::IgnoreUnknownOptions allowed only in the prefixed variant"
                   );
  Error::~Error(&local_b8);
  abort();
}

Assistant:

Arguments::Arguments(Flags flags): _flags{InternalFlag(std::uint8_t(flags))}, _parseErrorCallback{defaultParseErrorCallback} {
    CORRADE_ASSERT(!(flags & Flag::IgnoreUnknownOptions),
        "Utility::Arguments: Flag::IgnoreUnknownOptions allowed only in the prefixed variant", );

    /* Add help option */
    addBooleanOption('h', "help");
    setHelp("help", "display this help message and exit");
}